

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

void fiobj_data_seek(FIOBJ io,intptr_t position)

{
  size_t sVar1;
  long local_20;
  int64_t len;
  intptr_t position_local;
  FIOBJ io_local;
  
  if ((io != 0) && (sVar1 = fiobj_type_is(io,FIOBJ_T_DATA), sVar1 != 0)) {
    len = position;
    if (*(uint *)(io + 0x30) < 0xfffffffe) {
      *(undefined8 *)(io + 0x28) = 0;
      *(undefined8 *)(io + 0x20) = 0;
      if (position == 0) {
        *(undefined8 *)(io + 0x10) = 0;
      }
      else {
        local_20 = fiobj_data_get_fd_size(io);
        if (local_20 < 0) {
          local_20 = 0;
        }
        if (position < 1) {
          if (local_20 < -position) {
            len = 0;
          }
          else {
            len = local_20 + position;
          }
          *(int64_t *)(io + 0x10) = len;
        }
        else {
          if (local_20 < position) {
            len = local_20;
          }
          *(int64_t *)(io + 0x10) = len;
        }
      }
    }
    else if (position == 0) {
      *(undefined8 *)(io + 0x28) = 0;
    }
    else if (position < 1) {
      if (*(ulong *)(io + 0x20) < (ulong)-position) {
        len = 0;
      }
      else {
        len = *(long *)(io + 0x20) + position;
      }
      *(int64_t *)(io + 0x28) = len;
    }
    else {
      if (*(ulong *)(io + 0x20) < (ulong)position) {
        len = *(int64_t *)(io + 0x20);
      }
      *(int64_t *)(io + 0x28) = len;
    }
  }
  return;
}

Assistant:

void fiobj_data_seek(FIOBJ io, intptr_t position) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA))
    return;
  switch (obj2io(io)->fd) {
  case -1: /* fallthrough */
  case -2:
    /* String / Slice code */
    if (position == 0) {
      obj2io(io)->pos = 0;
      return;
    }
    if (position > 0) {
      if ((uintptr_t)position > obj2io(io)->len)
        position = obj2io(io)->len;
      obj2io(io)->pos = position;
      return;
    }
    position = (0 - position);
    if ((uintptr_t)position > obj2io(io)->len)
      position = 0;
    else
      position = obj2io(io)->len - position;
    obj2io(io)->pos = position;
    return;
    break;
  default:
    /* File code */
    obj2io(io)->pos = 0;
    obj2io(io)->len = 0;

    if (position == 0) {
      obj2io(io)->source.fpos = 0;
      return;
    }
    int64_t len = fiobj_data_get_fd_size(io);
    if (len < 0)
      len = 0;
    if (position > 0) {
      if (position > len)
        position = len;

      obj2io(io)->source.fpos = position;
      return;
    }
    position = (0 - position);
    if (position > len)
      position = 0;
    else
      position = len - position;
    obj2io(io)->source.fpos = position;
    return;
  }
}